

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprint.c
# Opt level: O3

void PPrintDocType(TidyDocImpl *doc,uint indent,Node *node)

{
  TidyPrintImpl *pprint;
  int iVar1;
  uint uVar2;
  uint indent_00;
  uint uVar3;
  AttVal *pAVar4;
  AttVal *pAVar5;
  uint uVar6;
  int iVar7;
  
  pprint = &doc->pprint;
  iVar1 = *(int *)((doc->config).value + 0x26);
  uVar6 = *(uint *)((doc->config).value + 0x5d);
  pAVar4 = prvTidyGetAttrByName(node,"PUBLIC");
  pAVar5 = prvTidyGetAttrByName(node,"SYSTEM");
  uVar3 = (doc->pprint).linelen;
  if ((ulong)(uVar3 + indent) < (doc->config).value[0x5d].v) {
    if ((doc->pprint).indent[0].spaces < 0) {
      (doc->pprint).indent[0].spaces = indent;
    }
    (doc->pprint).wraphere = uVar3;
  }
  else if ((doc->pprint).ixInd == 0) {
    (doc->pprint).indent[1].spaces = indent;
    (doc->pprint).ixInd = 1;
  }
  PCondFlushLineSmart(doc,indent);
  AddString(pprint,"<!DOCTYPE ");
  uVar3 = (doc->pprint).linelen;
  if ((ulong)(uVar3 + indent) < (doc->config).value[0x5d].v) {
    if ((doc->pprint).indent[0].spaces < 0) {
      (doc->pprint).indent[0].spaces = indent;
    }
    (doc->pprint).wraphere = uVar3;
  }
  else if ((doc->pprint).ixInd == 0) {
    (doc->pprint).indent[1].spaces = indent;
    (doc->pprint).ixInd = 1;
  }
  if (node->element != (ctmbstr)0x0) {
    AddString(pprint,node->element);
  }
  if ((pAVar4 == (AttVal *)0x0) || (pAVar4->value == (tmbstr)0x0)) {
LAB_00148d3e:
    if (pAVar5 == (AttVal *)0x0) goto LAB_00148d84;
LAB_00148d43:
    if (pAVar5->value != (tmbstr)0x0) {
      AddString(pprint," SYSTEM ");
    }
  }
  else {
    AddString(pprint," PUBLIC ");
    AddChar(pprint,pAVar4->delim);
    AddString(pprint,pAVar4->value);
    AddChar(pprint,pAVar4->delim);
    if (pAVar5 == (AttVal *)0x0 || pAVar4->value == (tmbstr)0x0) goto LAB_00148d3e;
    if (pAVar5->value == (ctmbstr)0x0) goto LAB_00148d43;
    uVar3 = (doc->pprint).linelen;
    uVar2 = prvTidytmbstrlen(pAVar5->value);
    iVar7 = uVar3 - uVar2;
    indent_00 = iVar7 - 3;
    if (indent_00 == 0) {
LAB_00148d1b:
      indent_00 = 0;
    }
    else {
      uVar3 = prvTidytmbstrlen(pAVar5->value);
      if (uVar6 <= (uVar3 + iVar7) - 1) goto LAB_00148d1b;
      uVar6 = 4;
      if (iVar1 != 0) {
        uVar6 = iVar1 * 2;
      }
      if (uVar6 < indent_00) goto LAB_00148d1b;
    }
    PCondFlushLineSmart(doc,indent_00);
    if ((doc->pprint).linelen != 0) {
      AddChar(pprint,0x20);
    }
  }
  if (pAVar5->value != (tmbstr)0x0) {
    AddChar(pprint,pAVar5->delim);
    AddString(pprint,pAVar5->value);
    AddChar(pprint,pAVar5->delim);
  }
LAB_00148d84:
  if (node->content != (Node *)0x0) {
    PCondFlushLineSmart(doc,indent);
    AddChar(pprint,0x5b);
    PPrintText(doc,0x10,0,node->content);
    AddChar(pprint,0x5d);
  }
  uVar6 = (doc->pprint).linelen;
  if ((ulong)uVar6 < (doc->config).value[0x5d].v) {
    if ((doc->pprint).indent[0].spaces < 0) {
      (doc->pprint).indent[0].spaces = 0;
    }
    (doc->pprint).wraphere = uVar6;
  }
  else if ((doc->pprint).ixInd == 0) {
    (doc->pprint).indent[1].spaces = 0;
    (doc->pprint).ixInd = 1;
  }
  AddChar(pprint,0x3e);
  PCondFlushLineSmart(doc,indent);
  return;
}

Assistant:

static void PPrintDocType( TidyDocImpl* doc, uint indent, Node *node )
{
    TidyPrintImpl* pprint = &doc->pprint;
    uint wraplen = cfg( doc, TidyWrapLen );
    uint spaces = cfg( doc, TidyIndentSpaces );
    AttVal* fpi = TY_(GetAttrByName)(node, "PUBLIC");
    AttVal* sys = TY_(GetAttrByName)(node, "SYSTEM");

    /* todo: handle non-ASCII characters in FPI / SI / node->element */

    SetWrap( doc, indent );
    PCondFlushLineSmart( doc, indent );

    AddString( pprint, "<!DOCTYPE " );
    SetWrap( doc, indent );
    if (node->element)
    {
        AddString(pprint, node->element);
    }

    if (fpi && fpi->value)
    {
        AddString(pprint, " PUBLIC ");
        AddChar(pprint, fpi->delim);
        AddString(pprint, fpi->value);
        AddChar(pprint, fpi->delim);
    }

    if (fpi && fpi->value && sys && sys->value)
    {
        uint i = pprint->linelen - (TY_(tmbstrlen)(sys->value) + 2) - 1;
        if (!(i>0&&TY_(tmbstrlen)(sys->value)+2+i<wraplen&&i<=(spaces?spaces:2)*2))
            i = 0;

        PCondFlushLineSmart(doc, i);
        if (pprint->linelen)
            AddChar(pprint, ' ');
    }
    else if (sys && sys->value)
    {
        AddString(pprint, " SYSTEM ");
    }

    if (sys && sys->value)
    {
        AddChar(pprint, sys->delim);
        AddString(pprint, sys->value);
        AddChar(pprint, sys->delim);
    }

    if (node->content)
    {
        PCondFlushLineSmart(doc, indent);
        AddChar(pprint, '[');
        PPrintText(doc, CDATA, 0, node->content);
        AddChar(pprint, ']');
    }

    SetWrap( doc, 0 );
    AddChar( pprint, '>' );
    PCondFlushLineSmart( doc, indent );
}